

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear_glfw_gl2.h
# Opt level: O0

void nk_glfw3_new_frame(void)

{
  GLFWwindow *handle;
  int iVar1;
  int iVar2;
  int iVar3;
  bool local_39;
  GLFWwindow *win;
  nk_context *ctx;
  double y;
  double x;
  int i;
  
  handle = glfw.win;
  glfwGetWindowSize(glfw.win,&glfw.width,&glfw.height);
  glfwGetFramebufferSize(handle,&glfw.display_width,&glfw.display_height);
  glfw.fb_scale.x = (float)glfw.display_width / (float)glfw.width;
  glfw.fb_scale.y = (float)glfw.display_height / (float)glfw.height;
  nk_input_begin(&glfw.ctx);
  for (x._4_4_ = 0; x._4_4_ < glfw.text_len; x._4_4_ = x._4_4_ + 1) {
    nk_input_unicode(&glfw.ctx,glfw.text[x._4_4_]);
  }
  if (glfw.ctx.input.mouse.grab == '\0') {
    if (glfw.ctx.input.mouse.ungrab != '\0') {
      glfwSetInputMode(glfw.win,0x33001,0x34001);
    }
  }
  else {
    glfwSetInputMode(glfw.win,0x33001,0x34002);
  }
  iVar1 = glfwGetKey(handle,0x105);
  nk_input_key(&glfw.ctx,NK_KEY_DEL,(uint)(iVar1 == 1));
  iVar1 = glfwGetKey(handle,0x101);
  nk_input_key(&glfw.ctx,NK_KEY_ENTER,(uint)(iVar1 == 1));
  iVar1 = glfwGetKey(handle,0x102);
  nk_input_key(&glfw.ctx,NK_KEY_TAB,(uint)(iVar1 == 1));
  iVar1 = glfwGetKey(handle,0x103);
  nk_input_key(&glfw.ctx,NK_KEY_BACKSPACE,(uint)(iVar1 == 1));
  iVar1 = glfwGetKey(handle,0x109);
  nk_input_key(&glfw.ctx,NK_KEY_UP,(uint)(iVar1 == 1));
  iVar1 = glfwGetKey(handle,0x108);
  nk_input_key(&glfw.ctx,NK_KEY_DOWN,(uint)(iVar1 == 1));
  iVar1 = glfwGetKey(handle,0x10c);
  nk_input_key(&glfw.ctx,NK_KEY_TEXT_START,(uint)(iVar1 == 1));
  iVar1 = glfwGetKey(handle,0x10d);
  nk_input_key(&glfw.ctx,NK_KEY_TEXT_END,(uint)(iVar1 == 1));
  iVar1 = glfwGetKey(handle,0x10c);
  nk_input_key(&glfw.ctx,NK_KEY_SCROLL_START,(uint)(iVar1 == 1));
  iVar1 = glfwGetKey(handle,0x10d);
  nk_input_key(&glfw.ctx,NK_KEY_SCROLL_END,(uint)(iVar1 == 1));
  iVar1 = glfwGetKey(handle,0x10b);
  nk_input_key(&glfw.ctx,NK_KEY_SCROLL_DOWN,(uint)(iVar1 == 1));
  iVar1 = glfwGetKey(handle,0x10a);
  nk_input_key(&glfw.ctx,NK_KEY_SCROLL_UP,(uint)(iVar1 == 1));
  iVar1 = glfwGetKey(handle,0x154);
  local_39 = true;
  if (iVar1 != 1) {
    iVar1 = glfwGetKey(handle,0x158);
    local_39 = iVar1 == 1;
  }
  nk_input_key(&glfw.ctx,NK_KEY_SHIFT,(uint)local_39);
  iVar1 = glfwGetKey(handle,0x155);
  if ((iVar1 == 1) || (iVar1 = glfwGetKey(handle,0x159), iVar1 == 1)) {
    iVar1 = glfwGetKey(handle,0x43);
    nk_input_key(&glfw.ctx,NK_KEY_COPY,(uint)(iVar1 == 1));
    iVar1 = glfwGetKey(handle,0x56);
    nk_input_key(&glfw.ctx,NK_KEY_PASTE,(uint)(iVar1 == 1));
    iVar1 = glfwGetKey(handle,0x58);
    nk_input_key(&glfw.ctx,NK_KEY_CUT,(uint)(iVar1 == 1));
    iVar1 = glfwGetKey(handle,0x5a);
    nk_input_key(&glfw.ctx,NK_KEY_TEXT_UNDO,(uint)(iVar1 == 1));
    iVar1 = glfwGetKey(handle,0x52);
    nk_input_key(&glfw.ctx,NK_KEY_TEXT_REDO,(uint)(iVar1 == 1));
    iVar1 = glfwGetKey(handle,0x107);
    nk_input_key(&glfw.ctx,NK_KEY_TEXT_WORD_LEFT,(uint)(iVar1 == 1));
    iVar1 = glfwGetKey(handle,0x106);
    nk_input_key(&glfw.ctx,NK_KEY_TEXT_WORD_RIGHT,(uint)(iVar1 == 1));
    iVar1 = glfwGetKey(handle,0x42);
    nk_input_key(&glfw.ctx,NK_KEY_TEXT_LINE_START,(uint)(iVar1 == 1));
    iVar1 = glfwGetKey(handle,0x45);
    nk_input_key(&glfw.ctx,NK_KEY_TEXT_LINE_END,(uint)(iVar1 == 1));
  }
  else {
    iVar1 = glfwGetKey(handle,0x107);
    nk_input_key(&glfw.ctx,NK_KEY_LEFT,(uint)(iVar1 == 1));
    iVar1 = glfwGetKey(handle,0x106);
    nk_input_key(&glfw.ctx,NK_KEY_RIGHT,(uint)(iVar1 == 1));
    nk_input_key(&glfw.ctx,NK_KEY_COPY,0);
    nk_input_key(&glfw.ctx,NK_KEY_PASTE,0);
    nk_input_key(&glfw.ctx,NK_KEY_CUT,0);
    nk_input_key(&glfw.ctx,NK_KEY_SHIFT,0);
  }
  glfwGetCursorPos(handle,&y,(double *)&ctx);
  nk_input_motion(&glfw.ctx,(int)y,(int)(double)ctx);
  if (glfw.ctx.input.mouse.grabbed != '\0') {
    glfwSetCursorPos(glfw.win,(double)glfw.ctx.input.mouse.prev.x,
                     (double)glfw.ctx.input.mouse.prev.y);
    glfw.ctx.input.mouse.pos.x = glfw.ctx.input.mouse.prev.x;
    glfw.ctx.input.mouse.pos.y = glfw.ctx.input.mouse.prev.y;
  }
  iVar1 = (int)y;
  iVar2 = (int)(double)ctx;
  iVar3 = glfwGetMouseButton(handle,0);
  nk_input_button(&glfw.ctx,NK_BUTTON_LEFT,iVar1,iVar2,(uint)(iVar3 == 1));
  iVar1 = (int)y;
  iVar2 = (int)(double)ctx;
  iVar3 = glfwGetMouseButton(handle,2);
  nk_input_button(&glfw.ctx,NK_BUTTON_MIDDLE,iVar1,iVar2,(uint)(iVar3 == 1));
  iVar1 = glfwGetMouseButton(handle,1);
  nk_input_button(&glfw.ctx,NK_BUTTON_RIGHT,(int)y,(int)(double)ctx,(uint)(iVar1 == 1));
  nk_input_button(&glfw.ctx,NK_BUTTON_DOUBLE,(int)glfw.double_click_pos.x,
                  (int)glfw.double_click_pos.y,glfw.is_double_click_down);
  nk_input_scroll(&glfw.ctx,glfw.scroll);
  nk_input_end(&glfw.ctx);
  glfw.text_len = 0;
  glfw.scroll = nk_vec2(0.0,0.0);
  return;
}

Assistant:

NK_API void
nk_glfw3_new_frame(void)
{
    int i;
    double x, y;
    struct nk_context *ctx = &glfw.ctx;
    struct GLFWwindow *win = glfw.win;

    glfwGetWindowSize(win, &glfw.width, &glfw.height);
    glfwGetFramebufferSize(win, &glfw.display_width, &glfw.display_height);
    glfw.fb_scale.x = (float)glfw.display_width/(float)glfw.width;
    glfw.fb_scale.y = (float)glfw.display_height/(float)glfw.height;

    nk_input_begin(ctx);
    for (i = 0; i < glfw.text_len; ++i)
        nk_input_unicode(ctx, glfw.text[i]);

    /* optional grabbing behavior */
    if (ctx->input.mouse.grab)
        glfwSetInputMode(glfw.win, GLFW_CURSOR, GLFW_CURSOR_HIDDEN);
    else if (ctx->input.mouse.ungrab)
        glfwSetInputMode(glfw.win, GLFW_CURSOR, GLFW_CURSOR_NORMAL);

    nk_input_key(ctx, NK_KEY_DEL, glfwGetKey(win, GLFW_KEY_DELETE) == GLFW_PRESS);
    nk_input_key(ctx, NK_KEY_ENTER, glfwGetKey(win, GLFW_KEY_ENTER) == GLFW_PRESS);
    nk_input_key(ctx, NK_KEY_TAB, glfwGetKey(win, GLFW_KEY_TAB) == GLFW_PRESS);
    nk_input_key(ctx, NK_KEY_BACKSPACE, glfwGetKey(win, GLFW_KEY_BACKSPACE) == GLFW_PRESS);
    nk_input_key(ctx, NK_KEY_UP, glfwGetKey(win, GLFW_KEY_UP) == GLFW_PRESS);
    nk_input_key(ctx, NK_KEY_DOWN, glfwGetKey(win, GLFW_KEY_DOWN) == GLFW_PRESS);
    nk_input_key(ctx, NK_KEY_TEXT_START, glfwGetKey(win, GLFW_KEY_HOME) == GLFW_PRESS);
    nk_input_key(ctx, NK_KEY_TEXT_END, glfwGetKey(win, GLFW_KEY_END) == GLFW_PRESS);
    nk_input_key(ctx, NK_KEY_SCROLL_START, glfwGetKey(win, GLFW_KEY_HOME) == GLFW_PRESS);
    nk_input_key(ctx, NK_KEY_SCROLL_END, glfwGetKey(win, GLFW_KEY_END) == GLFW_PRESS);
    nk_input_key(ctx, NK_KEY_SCROLL_DOWN, glfwGetKey(win, GLFW_KEY_PAGE_DOWN) == GLFW_PRESS);
    nk_input_key(ctx, NK_KEY_SCROLL_UP, glfwGetKey(win, GLFW_KEY_PAGE_UP) == GLFW_PRESS);
    nk_input_key(ctx, NK_KEY_SHIFT, glfwGetKey(win, GLFW_KEY_LEFT_SHIFT) == GLFW_PRESS||
                                    glfwGetKey(win, GLFW_KEY_RIGHT_SHIFT) == GLFW_PRESS);

    if (glfwGetKey(win, GLFW_KEY_LEFT_CONTROL) == GLFW_PRESS ||
        glfwGetKey(win, GLFW_KEY_RIGHT_CONTROL) == GLFW_PRESS) {
        nk_input_key(ctx, NK_KEY_COPY, glfwGetKey(win, GLFW_KEY_C) == GLFW_PRESS);
        nk_input_key(ctx, NK_KEY_PASTE, glfwGetKey(win, GLFW_KEY_V) == GLFW_PRESS);
        nk_input_key(ctx, NK_KEY_CUT, glfwGetKey(win, GLFW_KEY_X) == GLFW_PRESS);
        nk_input_key(ctx, NK_KEY_TEXT_UNDO, glfwGetKey(win, GLFW_KEY_Z) == GLFW_PRESS);
        nk_input_key(ctx, NK_KEY_TEXT_REDO, glfwGetKey(win, GLFW_KEY_R) == GLFW_PRESS);
        nk_input_key(ctx, NK_KEY_TEXT_WORD_LEFT, glfwGetKey(win, GLFW_KEY_LEFT) == GLFW_PRESS);
        nk_input_key(ctx, NK_KEY_TEXT_WORD_RIGHT, glfwGetKey(win, GLFW_KEY_RIGHT) == GLFW_PRESS);
        nk_input_key(ctx, NK_KEY_TEXT_LINE_START, glfwGetKey(win, GLFW_KEY_B) == GLFW_PRESS);
        nk_input_key(ctx, NK_KEY_TEXT_LINE_END, glfwGetKey(win, GLFW_KEY_E) == GLFW_PRESS);
    } else {
        nk_input_key(ctx, NK_KEY_LEFT, glfwGetKey(win, GLFW_KEY_LEFT) == GLFW_PRESS);
        nk_input_key(ctx, NK_KEY_RIGHT, glfwGetKey(win, GLFW_KEY_RIGHT) == GLFW_PRESS);
        nk_input_key(ctx, NK_KEY_COPY, 0);
        nk_input_key(ctx, NK_KEY_PASTE, 0);
        nk_input_key(ctx, NK_KEY_CUT, 0);
        nk_input_key(ctx, NK_KEY_SHIFT, 0);
    }

    glfwGetCursorPos(win, &x, &y);
    nk_input_motion(ctx, (int)x, (int)y);
    if (ctx->input.mouse.grabbed) {
        glfwSetCursorPos(glfw.win, (double)ctx->input.mouse.prev.x, (double)ctx->input.mouse.prev.y);
        ctx->input.mouse.pos.x = ctx->input.mouse.prev.x;
        ctx->input.mouse.pos.y = ctx->input.mouse.prev.y;
    }

    nk_input_button(ctx, NK_BUTTON_LEFT, (int)x, (int)y, glfwGetMouseButton(win, GLFW_MOUSE_BUTTON_LEFT) == GLFW_PRESS);
    nk_input_button(ctx, NK_BUTTON_MIDDLE, (int)x, (int)y, glfwGetMouseButton(win, GLFW_MOUSE_BUTTON_MIDDLE) == GLFW_PRESS);
    nk_input_button(ctx, NK_BUTTON_RIGHT, (int)x, (int)y, glfwGetMouseButton(win, GLFW_MOUSE_BUTTON_RIGHT) == GLFW_PRESS);
    nk_input_button(ctx, NK_BUTTON_DOUBLE, (int)glfw.double_click_pos.x, (int)glfw.double_click_pos.y, glfw.is_double_click_down);
    nk_input_scroll(ctx, glfw.scroll);
    nk_input_end(&glfw.ctx);
    glfw.text_len = 0;
    glfw.scroll = nk_vec2(0,0);
}